

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

void SVGChart::MakeExamplePlot7(PPlot *ioPPlot)

{
  PlotData *pPVar1;
  LegendData *this;
  PColor local_47 [5];
  LegendData *local_38;
  LegendData *theLegend;
  int local_28;
  float local_24;
  int theI;
  float theFac;
  PlotData *theY1;
  PlotData *theX1;
  PPlot *ioPPlot_local;
  
  theX1 = (PlotData *)ioPPlot;
  pPVar1 = (PlotData *)operator_new(0x20);
  memset(pPVar1,0,0x20);
  PlotData::PlotData(pPVar1);
  theY1 = pPVar1;
  pPVar1 = (PlotData *)operator_new(0x20);
  memset(pPVar1,0,0x20);
  PlotData::PlotData(pPVar1);
  local_24 = 0.0001;
  _theI = pPVar1;
  for (local_28 = 0; local_28 < 0x65; local_28 = local_28 + 1) {
    theLegend._4_4_ = (float)local_28 * 0.001 + 0.0001;
    std::vector<float,_std::allocator<float>_>::push_back
              (&theY1->super_RealPlotData,(value_type *)((long)&theLegend + 4));
    theLegend._0_4_ = local_24 * (float)local_28 * (float)local_28 * (float)local_28 + 0.01;
    std::vector<float,_std::allocator<float>_>::push_back
              (&_theI->super_RealPlotData,(value_type *)&theLegend);
  }
  this = (LegendData *)operator_new(0xa8);
  LegendData::LegendData(this);
  local_38 = this;
  std::__cxx11::string::operator=((string *)this,"foo");
  PColor::PColor(local_47,100,100,200);
  (local_38->mColor).mR = local_47[0].mR;
  (local_38->mColor).mG = local_47[0].mG;
  (local_38->mColor).mB = local_47[0].mB;
  PlotDataContainer::AddXYPlot
            ((PlotDataContainer *)&theX1->super_RealPlotData,&theY1->super_PlotDataBase,
             &_theI->super_PlotDataBase,local_38,(DataDrawerBase *)0x0,(PlotDataSelection *)0x0);
  *(undefined1 *)
   ((long)&theX1[0x10].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start + 3) = 1;
  theX1[0x10].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x14;
  theX1[0x1c].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x32;
  theX1[0x1c].super_RealPlotData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x14;
  *(undefined1 *)&theX1[0x1c].super_PlotDataBase._vptr_PlotDataBase = 1;
  *(undefined1 *)((long)&theX1[0x1c].super_PlotDataBase._vptr_PlotDataBase + 1) = 1;
  return;
}

Assistant:

void MakeExamplePlot7 (PPlot &ioPPlot) {

      PlotData *theX1 = new PlotData ();
      PlotData *theY1 = new PlotData ();
      float theFac = 100.0f/(100*100*100);
      for (int theI=0;theI<=100;theI++) {
        theX1->push_back (0.0001+theI*0.001);
        theY1->push_back (0.01+theFac*theI*theI*theI);
      }
      LegendData *theLegend = new LegendData ();
      theLegend->mName = "foo";
      theLegend->mColor = PColor (100,100,200);
      ioPPlot.mPlotDataContainer.AddXYPlot (theX1, theY1, theLegend);
      ioPPlot.mYAxisSetup.mLogScale = true;
      ioPPlot.mYAxisSetup.mLogFactor = 20;
      ioPPlot.mMargins.mLeft = 50;
      ioPPlot.mMargins.mTop = 20;

      ioPPlot.mGridInfo.mXGridOn = true;
      ioPPlot.mGridInfo.mYGridOn = true;
    }